

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSchemasBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  long lVar1;
  char cVar2;
  reference pvVar3;
  pointer pEVar4;
  type pEVar5;
  long lVar6;
  pointer pCVar7;
  BinderException *this_00;
  NotImplementedException *this_01;
  LogicalType aLStack_178 [32];
  vector<duckdb::Value,_true> schema_list;
  undefined8 local_138 [8];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_f8;
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  Value schema_value;
  char local_98;
  Value result_val;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if (pEVar4[0x38] != (Expression)0xa) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_138,"current_schemas requires a boolean input",
               (allocator *)&schema_value);
    duckdb::BinderException::BinderException(this_00,(string *)local_138);
    __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  cVar2 = (**(code **)(*(long *)pEVar4 + 0x78))(pEVar4);
  if (cVar2 != '\0') {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
    duckdb::ExpressionExecutor::EvaluateScalar
              ((ClientContext *)&schema_value,(Expression *)context,SUB81(pEVar5,0));
    duckdb::LogicalType::LogicalType(local_c8,SQLNULL);
    duckdb::Value::Value(&result_val,local_c8);
    duckdb::LogicalType::~LogicalType(local_c8);
    if (local_98 == '\x01') {
      duckdb::LogicalType::LogicalType(aLStack_178,VARCHAR);
      duckdb::LogicalType::LIST(local_e0);
      duckdb::Value::Value((Value *)local_138,local_e0);
      duckdb::Value::operator=(&result_val,(Value *)local_138);
      duckdb::Value::~Value((Value *)local_138);
      duckdb::LogicalType::~LogicalType(local_e0);
      duckdb::LogicalType::~LogicalType(aLStack_178);
    }
    else {
      cVar2 = duckdb::BooleanValue::Get(&schema_value);
      schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = duckdb::ClientData::Get(context);
      if (cVar2 == '\0') {
        pCVar7 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                 ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                               *)(lVar6 + 0x78));
        pCVar7 = pCVar7 + 0x20;
      }
      else {
        unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
        ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)(lVar6 + 0x78));
        pCVar7 = (pointer)duckdb::CatalogSearchPath::Get();
      }
      lVar1 = *(long *)(pCVar7 + 8);
      for (lVar6 = *(long *)pCVar7; lVar6 != lVar1; lVar6 = lVar6 + 0x40) {
        std::__cxx11::string::string((string *)aLStack_178,(string *)(lVar6 + 0x20));
        duckdb::Value::Value((Value *)local_138,aLStack_178);
        std::__cxx11::string::~string((string *)aLStack_178);
        std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  (&schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
                   (Value *)local_138);
        duckdb::Value::~Value((Value *)local_138);
      }
      duckdb::LogicalType::LogicalType(aLStack_178,VARCHAR);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (&local_f8,&schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
      ;
      duckdb::Value::LIST(local_138,aLStack_178,&local_f8);
      duckdb::Value::operator=(&result_val,(Value *)local_138);
      duckdb::Value::~Value((Value *)local_138);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_f8);
      duckdb::LogicalType::~LogicalType(aLStack_178);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                (&schema_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    }
    make_uniq<duckdb::CurrentSchemasBindData,duckdb::Value>((duckdb *)local_138,&result_val);
    *(undefined8 *)this = local_138[0];
    duckdb::Value::~Value(&result_val);
    duckdb::Value::~Value(&schema_value);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_138,"current_schemas requires a constant input",
             (allocator *)&schema_value);
  duckdb::NotImplementedException::NotImplementedException(this_01,(string *)local_138);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> CurrentSchemasBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() != LogicalTypeId::BOOLEAN) {
		throw BinderException("current_schemas requires a boolean input");
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("current_schemas requires a constant input");
	}
	Value schema_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	Value result_val;
	if (schema_value.IsNull()) {
		// null
		result_val = Value(LogicalType::LIST(LogicalType::VARCHAR));
	} else {
		auto implicit_schemas = BooleanValue::Get(schema_value);
		vector<Value> schema_list;
		auto &catalog_search_path = ClientData::Get(context).catalog_search_path;
		auto &search_path = implicit_schemas ? catalog_search_path->Get() : catalog_search_path->GetSetPaths();
		std::transform(search_path.begin(), search_path.end(), std::back_inserter(schema_list),
		               [](const CatalogSearchEntry &s) -> Value { return Value(s.schema); });
		result_val = Value::LIST(LogicalType::VARCHAR, schema_list);
	}
	return make_uniq<CurrentSchemasBindData>(std::move(result_val));
}